

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_server.cpp
# Opt level: O2

int __thiscall zmq::plain_server_t::next_handshake_command(plain_server_t *this,msg_t *msg_)

{
  int iVar1;
  int *piVar2;
  
  iVar1 = *(int *)&(this->super_zap_client_common_handshake_t).super_zap_client_t.field_0x48;
  if (iVar1 == 5) {
    produce_error(this,msg_);
    *(undefined4 *)&(this->super_zap_client_common_handshake_t).super_zap_client_t.field_0x48 = 6;
  }
  else if (iVar1 == 4) {
    produce_ready(this,msg_);
    *(undefined4 *)&(this->super_zap_client_common_handshake_t).super_zap_client_t.field_0x48 = 7;
  }
  else {
    if (iVar1 != 1) {
      piVar2 = __errno_location();
      *piVar2 = 0xb;
      return -1;
    }
    produce_welcome(msg_);
    *(undefined4 *)&(this->super_zap_client_common_handshake_t).super_zap_client_t.field_0x48 = 2;
  }
  return 0;
}

Assistant:

int zmq::plain_server_t::next_handshake_command (msg_t *msg_)
{
    int rc = 0;

    switch (state) {
        case sending_welcome:
            produce_welcome (msg_);
            state = waiting_for_initiate;
            break;
        case sending_ready:
            produce_ready (msg_);
            state = ready;
            break;
        case sending_error:
            produce_error (msg_);
            state = error_sent;
            break;
        default:
            errno = EAGAIN;
            rc = -1;
    }
    return rc;
}